

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-common.h
# Opt level: O0

int aesctr_setup_crypto(ptls_cipher_context_t *_ctx,int is_enc,void *key)

{
  aesctr_context_t *ctx;
  void *key_local;
  int is_enc_local;
  ptls_cipher_context_t *_ctx_local;
  
  _ctx->do_dispose = aesctr_dispose;
  _ctx->do_init = aesctr_init;
  _ctx->do_transform = aesctr_transform;
  cf_aes_init((cf_aes_context *)(_ctx + 1),(uint8_t *)key,_ctx->algo->key_size);
  return 0;
}

Assistant:

static inline int aesctr_setup_crypto(ptls_cipher_context_t *_ctx, int is_enc, const void *key)
{
    struct aesctr_context_t *ctx = (struct aesctr_context_t *)_ctx;
    ctx->super.do_dispose = aesctr_dispose;
    ctx->super.do_init = aesctr_init;
    ctx->super.do_transform = aesctr_transform;
    cf_aes_init(&ctx->aes, key, ctx->super.algo->key_size);
    return 0;
}